

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskBitCount>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskBitCount> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  ConstPixelBufferAccess *local_38;
  ConstPixelBufferAccess *dataRS_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *dataPerSample_local;
  VkImageCreateInfo *imageRSInfo_local;
  VkImageCreateInfo *imageMSInfo_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskBitCount> *this_local;
  
  local_38 = dataRS;
  dataRS_local = (ConstPixelBufferAccess *)dataPerSample;
  dataPerSample_local =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
       imageRSInfo;
  imageRSInfo_local = imageMSInfo;
  imageMSInfo_local = (VkImageCreateInfo *)this;
  this_local = (MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskBitCount> *)
               __return_storage_ptr__;
  bVar1 = checkForErrorMS(imageMSInfo,dataPerSample,0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "gl_SampleMaskIn has more than one bit set for some shader invocations",&local_59);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Passed",&local_91);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleMaskBitCount>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	DE_UNREF(imageRSInfo);
	DE_UNREF(dataRS);

	if (checkForErrorMS(imageMSInfo, dataPerSample, 0))
		return tcu::TestStatus::fail("gl_SampleMaskIn has more than one bit set for some shader invocations");

	return tcu::TestStatus::pass("Passed");
}